

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# access.c
# Opt level: O0

void CheckMapLinks(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  AttVal *av;
  AttVal *href;
  Node *child;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  BVar1 = Level3_Enabled(doc);
  if (BVar1 != no) {
    for (href = (AttVal *)node->content; href != (AttVal *)0x0; href = (AttVal *)href->asp) {
      if (((href != (AttVal *)0x0) && (href[1].next != (AttVal *)0x0)) &&
         (*(int *)&(href[1].next)->next == 7)) {
        av = prvTidyAttrGetById((Node *)href,TidyAttr_HREF);
        BVar1 = hasValue(av);
        if ((BVar1 != no) && (BVar1 = FindLinkA(doc,&doc->root,av->value), BVar1 == no)) {
          prvTidyReportAccessError(doc,node,0x2ac);
        }
      }
    }
  }
  return;
}

Assistant:

static void CheckMapLinks( TidyDocImpl* doc, Node* node )
{
    Node* child;

    if (!Level3_Enabled( doc ))
        return;

    /* Stores the 'HREF' link of an AREA element within a MAP element */
    for ( child = node->content; child != NULL; child = child->next )
    {
        if ( nodeIsAREA(child) )
        {
            /* Checks for 'HREF' attribute */                
            AttVal* href = attrGetHREF( child );
            if ( hasValue(href) &&
                 !FindLinkA( doc, &doc->root, href->value ) )
            {
                TY_(ReportAccessError)( doc, node, IMG_MAP_CLIENT_MISSING_TEXT_LINKS );
            }
        }
    }
}